

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vfa(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  code *pcVar4;
  code *fn;
  DisasJumpType DVar5;
  bool bVar6;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_m4,FLD_C_b4);
  uVar2 = get_field1(s,FLD_O_m5,FLD_C_d1);
  if ((uVar2 & 7) == 0 && (uVar1 & 0xff) == 3) {
    switch((s->fields).field_0x9) {
    case 0xe2:
      bVar6 = (uVar2 & 8) == 0;
      pcVar4 = gen_helper_gvec_vfs64;
      fn = gen_helper_gvec_vfs64s;
      break;
    case 0xe3:
      bVar6 = (uVar2 & 8) == 0;
      pcVar4 = gen_helper_gvec_vfa64;
      fn = gen_helper_gvec_vfa64s;
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate_vx.inc.c"
                 ,0xa40,(char *)0x0);
    case 0xe5:
      bVar6 = (uVar2 & 8) == 0;
      pcVar4 = gen_helper_gvec_vfd64;
      fn = gen_helper_gvec_vfd64s;
      break;
    case 0xe7:
      bVar6 = (uVar2 & 8) == 0;
      pcVar4 = gen_helper_gvec_vfm64;
      fn = gen_helper_gvec_vfm64s;
    }
    if (bVar6) {
      fn = pcVar4;
    }
    DVar5 = DISAS_NEXT;
    iVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
    dofs = vec_full_reg_offset((uint8_t)iVar3);
    iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
    aofs = vec_full_reg_offset((uint8_t)iVar3);
    iVar3 = get_field1(s,FLD_O_v3,FLD_C_i3);
    bofs = vec_full_reg_offset((uint8_t)iVar3);
    tcg_gen_gvec_3_ptr_s390x(tcg_ctx,dofs,aofs,bofs,tcg_ctx->cpu_env,0x10,0x10,0,fn);
  }
  else {
    gen_program_exception(s,6);
    DVar5 = DISAS_NORETURN;
  }
  return DVar5;
}

Assistant:

static DisasJumpType op_vfa(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t fpf = get_field(s, m4);
    const uint8_t m5 = get_field(s, m5);
    const bool se = extract32(m5, 3, 1);
    gen_helper_gvec_3_ptr *fn;

    if (fpf != FPF_LONG || extract32(m5, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    switch (s->fields.op2) {
    case 0xe3:
        fn = se ? gen_helper_gvec_vfa64s : gen_helper_gvec_vfa64;
        break;
    case 0xe5:
        fn = se ? gen_helper_gvec_vfd64s : gen_helper_gvec_vfd64;
        break;
    case 0xe7:
        fn = se ? gen_helper_gvec_vfm64s : gen_helper_gvec_vfm64;
        break;
    case 0xe2:
        fn = se ? gen_helper_gvec_vfs64s : gen_helper_gvec_vfs64;
        break;
    default:
        g_assert_not_reached();
    }
    gen_gvec_3_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2),
                   get_field(s, v3), tcg_ctx->cpu_env, 0, fn);
    return DISAS_NEXT;
}